

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O2

CollationKey * __thiscall icu_63::CollationKey::operator=(CollationKey *this,CollationKey *other)

{
  int32_t iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint uVar4;
  StackBufferOrFields *__src;
  StackBufferOrFields *__dest;
  uint newCapacity;
  
  if (this == other) {
    return this;
  }
  if (other->fHashCode == 2) {
    this->fFlagAndLength = this->fFlagAndLength & 0x80000000;
LAB_0022881b:
    iVar1 = 2;
  }
  else {
    newCapacity = other->fFlagAndLength & 0x7fffffff;
    uVar4 = this->fFlagAndLength;
    if ((int)uVar4 < 0) {
      iVar2 = (this->fUnion).fFields.fCapacity;
    }
    else {
      iVar2 = 0x20;
    }
    if (iVar2 < (int)newCapacity) {
      puVar3 = reallocate(this,newCapacity,0);
      uVar4 = this->fFlagAndLength;
      if (puVar3 == (uint8_t *)0x0) {
        this->fFlagAndLength = uVar4 & 0x80000000;
        goto LAB_0022881b;
      }
    }
    if (newCapacity != 0) {
      if ((int)uVar4 < 0) {
        __dest = (StackBufferOrFields *)(this->fUnion).fFields.fBytes;
      }
      else {
        __dest = &this->fUnion;
      }
      if (other->fFlagAndLength < 0) {
        __src = (StackBufferOrFields *)(other->fUnion).fFields.fBytes;
      }
      else {
        __src = &other->fUnion;
      }
      memcpy(__dest,__src,(ulong)newCapacity);
      uVar4 = this->fFlagAndLength;
    }
    this->fFlagAndLength = uVar4 & 0x80000000 | newCapacity;
    iVar1 = other->fHashCode;
  }
  this->fHashCode = iVar1;
  return this;
}

Assistant:

const CollationKey&
CollationKey::operator=(const CollationKey& other)
{
    if (this != &other)
    {
        if (other.isBogus())
        {
            return setToBogus();
        }

        int32_t length = other.getLength();
        if (length > getCapacity() && reallocate(length, 0) == NULL) {
            return setToBogus();
        }
        if (length > 0) {
            uprv_memcpy(getBytes(), other.getBytes(), length);
        }
        fFlagAndLength = (fFlagAndLength & 0x80000000) | length;
        fHashCode = other.fHashCode;
    }

    return *this;
}